

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strict_fstream.hpp
# Opt level: O3

char * __thiscall strict_fstream::strerror_abi_cxx11_(strict_fstream *this,int __errnum)

{
  char *__buf;
  int *piVar1;
  char *__s;
  size_t sVar2;
  char *extraout_RAX;
  
  __buf = (char *)operator_new(0x100);
  memset(__buf,0,0x100);
  piVar1 = __errno_location();
  __s = strerror_r(*piVar1,__buf,0x100);
  sVar2 = strlen(__s);
  *(strict_fstream **)this = this + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,__s,__s + sVar2);
  operator_delete(__buf,0x100);
  return extraout_RAX;
}

Assistant:

static std::string strerror()
{
    // Can't use std::string since we're pre-C++17
    std::vector<char> buff(256, '\0');

#ifdef _WIN32
    // Since strerror_s might set errno itself, we need to store it.
    const int err_num = errno;
    if (strerror_s(buff.data(), buff.size(), err_num) != 0) {
        return trim_to_null(buff);
    } else {
        return "Unknown error (" + std::to_string(err_num) + ")";
    }
#elif ((_POSIX_C_SOURCE >= 200112L || _XOPEN_SOURCE >= 600 || defined(__APPLE__) || defined(__FreeBSD__)) && ! _GNU_SOURCE) || defined(__MUSL__)
// XSI-compliant strerror_r()
    const int err_num = errno; // See above
    if (strerror_r(err_num, buff.data(), buff.size()) == 0) {
        return trim_to_null(buff);
    } else {
        return "Unknown error (" + std::to_string(err_num) + ")";
    }
#else
// GNU-specific strerror_r()
    char * p = strerror_r(errno, &buff[0], buff.size());
    return std::string(p, std::strlen(p));
#endif
}